

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ID.cpp
# Opt level: O0

ID * __thiscall ID_table_t::find(ID_table_t *this,string *id_name)

{
  bool bVar1;
  __type _Var2;
  reference pIVar3;
  undefined1 local_50 [32];
  __normal_iterator<const_ID_*,_std::vector<ID,_std::allocator<ID>_>_> local_30;
  const_iterator end;
  const_iterator ptr;
  string *id_name_local;
  ID_table_t *this_local;
  
  end = std::vector<ID,_std::allocator<ID>_>::cbegin(&this->table);
  local_30._M_current = (ID *)std::vector<ID,_std::allocator<ID>_>::cend(&this->table);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) {
      return (ID *)0x0;
    }
    __gnu_cxx::__normal_iterator<const_ID_*,_std::vector<ID,_std::allocator<ID>_>_>::operator->
              (&end);
    ID::get_name_abi_cxx11_((ID *)local_50);
    _Var2 = std::operator==(id_name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    if (_Var2) break;
    __gnu_cxx::__normal_iterator<const_ID_*,_std::vector<ID,_std::allocator<ID>_>_>::operator++
              (&end);
  }
  pIVar3 = __gnu_cxx::__normal_iterator<const_ID_*,_std::vector<ID,_std::allocator<ID>_>_>::
           operator*(&end);
  return pIVar3;
}

Assistant:

const ID* ID_table_t::find(const string id_name) const{
    vector<ID>::const_iterator ptr = table.cbegin();
    vector<ID>::const_iterator end  = table.cend();

    while(ptr != end){
        if(id_name == ptr->get_name())
            return &(*ptr);
        ++ptr;
    }
    return NULL;
}